

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O0

void __thiscall OSToken::~OSToken(OSToken *this)

{
  bool bVar1;
  reference ppOVar2;
  ObjectStoreToken *in_RDI;
  iterator i;
  set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> cleanUp;
  Mutex *in_stack_ffffffffffffff78;
  MutexFactory *in_stack_ffffffffffffff80;
  _Rb_tree_const_iterator<OSObject_*> *in_stack_ffffffffffffff88;
  _Self local_48;
  _Self local_40 [8];
  
  in_RDI->_vptr_ObjectStoreToken = (_func_int **)&PTR_setSOPIN_00223a90;
  std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::set
            ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
             in_stack_ffffffffffffff80,
             (set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
             in_stack_ffffffffffffff78);
  std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::clear
            ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)0x1de1c4);
  local_40[0]._M_node =
       (_Base_ptr)
       std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::begin
                 ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
                  in_stack_ffffffffffffff78);
  while( true ) {
    local_48._M_node =
         (_Base_ptr)
         std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::end
                   ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
                    in_stack_ffffffffffffff78);
    bVar1 = std::operator!=(local_40,&local_48);
    if (!bVar1) break;
    ppOVar2 = std::_Rb_tree_const_iterator<OSObject_*>::operator*
                        ((_Rb_tree_const_iterator<OSObject_*> *)in_stack_ffffffffffffff80);
    if (*ppOVar2 != (OSObject *)0x0) {
      (*(*ppOVar2)->_vptr_OSObject[1])();
    }
    std::_Rb_tree_const_iterator<OSObject_*>::operator++
              (in_stack_ffffffffffffff88,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  }
  if (in_RDI[0x1a]._vptr_ObjectStoreToken != (_func_int **)0x0) {
    (**(code **)(*in_RDI[0x1a]._vptr_ObjectStoreToken + 8))();
  }
  if ((in_RDI[0x19]._vptr_ObjectStoreToken != (_func_int **)0x0) &&
     (in_RDI[0x19]._vptr_ObjectStoreToken != (_func_int **)0x0)) {
    (**(code **)(*in_RDI[0x19]._vptr_ObjectStoreToken + 8))();
  }
  MutexFactory::i();
  MutexFactory::recycleMutex(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (in_RDI[0x18]._vptr_ObjectStoreToken != (_func_int **)0x0) {
    (**(code **)(*in_RDI[0x18]._vptr_ObjectStoreToken + 8))();
  }
  std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::~set
            ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)0x1de2d4);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1de2e5);
  std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::~set
            ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)0x1de2f3);
  std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::~set
            ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)0x1de301);
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  ObjectStoreToken::~ObjectStoreToken(in_RDI);
  return;
}

Assistant:

OSToken::~OSToken()
{
	// Clean up
	std::set<OSObject*> cleanUp = allObjects;
	allObjects.clear();

	for (std::set<OSObject*>::iterator i = cleanUp.begin(); i != cleanUp.end(); i++)
	{
		delete *i;
	}

	delete tokenDir;
	if (gen != NULL) delete gen;
	MutexFactory::i()->recycleMutex(tokenMutex);
	delete tokenObject;
}